

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::I_formatter<spdlog::details::scoped_padder>::format
          (I_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  undefined4 in_stack_ffffffffffffffa4;
  memory_buf_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (padding_info *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  iVar1 = to12h(in_RDX);
  fmt_helper::pad2(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  scoped_padder::~scoped_padder((scoped_padder *)CONCAT44(in_stack_ffffffffffffffa4,iVar1));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(to12h(tm_time), dest);
    }